

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
decodeOneStep(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
             char *filename)

{
  uint code;
  ostream *poVar1;
  char *pcVar2;
  allocator local_41;
  uint height;
  uint width;
  string local_38;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_38,filename,&local_41);
  code = lodepng::decode(__return_storage_ptr__,&width,&height,&local_38,LCT_RGBA,8);
  std::__cxx11::string::~string((string *)&local_38);
  if (code != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"decoder error ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,": ");
    pcVar2 = lodepng_error_text(code);
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> decodeOneStep(const char* filename)
{
    std::vector<unsigned char> image; //the raw pixels
    unsigned width, height;
    
    //decode
    unsigned error = lodepng::decode(image, width, height, filename);
    
    //if there's an error, display it
    if(error) std::cout << "decoder error " << error << ": " << lodepng_error_text(error) << std::endl;
    return image;
}